

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int resolve_string(dwarf_sections *dwarf_sections,int is_dwarf64,int is_bigendian,
                  uint64_t str_offsets_base,attr_val *val,backtrace_error_callback error_callback,
                  void *data,char **string)

{
  int iVar1;
  undefined1 local_80 [8];
  dwarf_buf offset_buf;
  uint64_t offset;
  backtrace_error_callback error_callback_local;
  attr_val *val_local;
  uint64_t str_offsets_base_local;
  int is_bigendian_local;
  int is_dwarf64_local;
  dwarf_sections *dwarf_sections_local;
  
  if (val->encoding == ATTR_VAL_STRING) {
    *string = (char *)val->u;
    dwarf_sections_local._4_4_ = 1;
  }
  else if (val->encoding == ATTR_VAL_STRING_INDEX) {
    iVar1 = 4;
    if (is_dwarf64 != 0) {
      iVar1 = 8;
    }
    offset_buf._56_8_ = (val->u).uint * (long)iVar1 + str_offsets_base;
    iVar1 = 4;
    if (is_dwarf64 != 0) {
      iVar1 = 8;
    }
    if (dwarf_sections->size[6] < (ulong)(offset_buf._56_8_ + (long)iVar1)) {
      (*error_callback)(data,"DW_FORM_strx value out of range",0);
      dwarf_sections_local._4_4_ = 0;
    }
    else {
      local_80 = (undefined1  [8])0x15e7cc;
      offset_buf.name = (char *)dwarf_sections->data[6];
      offset_buf.start = dwarf_sections->data[6] + offset_buf._56_8_;
      offset_buf.buf = (uchar *)(dwarf_sections->size[6] - offset_buf._56_8_);
      offset_buf.error_callback = (backtrace_error_callback)data;
      offset_buf.data._0_4_ = 0;
      offset_buf.left._0_4_ = is_bigendian;
      offset_buf._32_8_ = error_callback;
      offset_buf._56_8_ = read_offset((dwarf_buf *)local_80,is_dwarf64);
      if ((ulong)offset_buf._56_8_ < dwarf_sections->size[4]) {
        *string = (char *)(dwarf_sections->data[4] + offset_buf._56_8_);
        dwarf_sections_local._4_4_ = 1;
      }
      else {
        dwarf_buf_error((dwarf_buf *)local_80,"DW_FORM_strx offset out of range",0);
        dwarf_sections_local._4_4_ = 0;
      }
    }
  }
  else {
    dwarf_sections_local._4_4_ = 1;
  }
  return dwarf_sections_local._4_4_;
}

Assistant:

static int
resolve_string (const struct dwarf_sections *dwarf_sections, int is_dwarf64,
		int is_bigendian, uint64_t str_offsets_base,
		const struct attr_val *val,
		backtrace_error_callback error_callback, void *data,
		const char **string)
{
  switch (val->encoding)
    {
    case ATTR_VAL_STRING:
      *string = val->u.string;
      return 1;

    case ATTR_VAL_STRING_INDEX:
      {
	uint64_t offset;
	struct dwarf_buf offset_buf;

	offset = val->u.uint * (is_dwarf64 ? 8 : 4) + str_offsets_base;
	if (offset + (is_dwarf64 ? 8 : 4)
	    > dwarf_sections->size[DEBUG_STR_OFFSETS])
	  {
	    error_callback (data, "DW_FORM_strx value out of range", 0);
	    return 0;
	  }

	offset_buf.name = ".debug_str_offsets";
	offset_buf.start = dwarf_sections->data[DEBUG_STR_OFFSETS];
	offset_buf.buf = dwarf_sections->data[DEBUG_STR_OFFSETS] + offset;
	offset_buf.left = dwarf_sections->size[DEBUG_STR_OFFSETS] - offset;
	offset_buf.is_bigendian = is_bigendian;
	offset_buf.error_callback = error_callback;
	offset_buf.data = data;
	offset_buf.reported_underflow = 0;

	offset = read_offset (&offset_buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_STR])
	  {
	    dwarf_buf_error (&offset_buf,
			     "DW_FORM_strx offset out of range",
			     0);
	    return 0;
	  }
	*string = (const char *) dwarf_sections->data[DEBUG_STR] + offset;
	return 1;
      }

    default:
      return 1;
    }
}